

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# word2vec.c
# Opt level: O0

void * TrainModelThread(void *id)

{
  int iVar1;
  void *__ptr;
  void *__ptr_00;
  FILE *__stream;
  clock_t cVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  float fVar7;
  double dVar8;
  real ran;
  FILE *fi;
  real *neu1e;
  real *neu1;
  clock_t now;
  real g;
  real f;
  unsigned_long_long next_random;
  longlong local_iter;
  longlong label;
  longlong target;
  longlong c;
  longlong l2;
  longlong l1;
  longlong sen [1001];
  longlong last_word_count;
  longlong word_count;
  longlong sentence_position;
  longlong sentence_length;
  longlong last_word;
  longlong word;
  longlong cw;
  longlong d;
  longlong b;
  longlong a;
  void *id_local;
  
  sentence_position = 0;
  word_count = 0;
  last_word_count = 0;
  sen[1000] = 0;
  next_random = iter;
  __ptr = calloc(layer1_size,4);
  __ptr_00 = calloc(layer1_size,4);
  printf("Opening train file %s\n",train_file);
  __stream = fopen(train_file,"rb");
  if (__stream == (FILE *)0x0) {
    fprintf(_stderr,"no such file or directory: %s",train_file);
    exit(1);
  }
  _g = id;
  if (1 < num_threads) {
    fseek(__stream,(file_size / (long)num_threads) * (long)id,0);
  }
LAB_00103a51:
  do {
    if (10000 < last_word_count - sen[1000]) {
      word_count_actual = (last_word_count - sen[1000]) + word_count_actual;
      sen[1000] = last_word_count;
      if (1 < debug_mode) {
        cVar2 = clock();
        printf("%cAlpha: %f  Progress: %.2f%%  Words/thread/sec: %.2fk  ",(double)alpha,
               (double)(((float)word_count_actual / (float)(iter * train_words + 1)) * 100.0),
               (double)((float)word_count_actual / (((float)((cVar2 - start) + 1) / 1e+06) * 1000.0)
                       ),0xd);
        fflush(_stdout);
      }
      alpha = starting_alpha * (1.0 - (float)word_count_actual / (float)(iter * train_words + 1));
      if (alpha < starting_alpha * 0.0001) {
        alpha = starting_alpha * 0.0001;
      }
    }
    if (sentence_position == 0) {
LAB_00103be1:
      do {
        do {
          iVar1 = ReadWordIndex((FILE *)__stream);
          lVar3 = (long)iVar1;
          iVar1 = feof(__stream);
          if (iVar1 != 0) goto LAB_00103d3b;
        } while (lVar3 == -1);
        last_word_count = last_word_count + 1;
        if (lVar3 == 0) break;
        if (0.0 < sample) {
          dVar8 = sqrt((double)((float)vocab[lVar3].cn / (sample * (float)train_words)));
          _g = (void *)((long)_g * 0x5deece66d + 0xb);
          if ((float)(((dVar8 + 1.0) * (double)(sample * (float)train_words)) /
                     (double)vocab[lVar3].cn) < (float)g._0_2_ / 65536.0) goto LAB_00103be1;
        }
        sen[sentence_position + -1] = lVar3;
        sentence_position = sentence_position + 1;
      } while (sentence_position < 1000);
LAB_00103d3b:
      word_count = 0;
    }
    iVar1 = feof(__stream);
    if ((iVar1 == 0) && (last_word_count <= train_words / (long)num_threads)) {
      lVar3 = sen[word_count + -1];
      if (lVar3 != -1) {
        for (target = 0; target < layer1_size; target = target + 1) {
          *(undefined4 *)((long)__ptr + target * 4) = 0;
        }
        for (target = 0; target < layer1_size; target = target + 1) {
          *(undefined4 *)((long)__ptr_00 + target * 4) = 0;
        }
        _g = (void *)((long)_g * 0x5deece66d + 0xb);
        uVar6 = (ulong)_g % (ulong)(long)window;
        b = uVar6;
        if (cbow == 0) {
          for (; b < (long)((long)(window * 2 + 1) - uVar6); b = b + 1) {
            if ((((b != window) && (lVar4 = (word_count - window) + b, -1 < lVar4)) &&
                (lVar4 < sentence_position)) && (sen[lVar4 + -1] != -1)) {
              lVar4 = sen[lVar4 + -1] * layer1_size;
              for (target = 0; target < layer1_size; target = target + 1) {
                *(undefined4 *)((long)__ptr_00 + target * 4) = 0;
              }
              if (hs != 0) {
                for (cw = 0; cw < vocab[lVar3].codelen; cw = cw + 1) {
                  now._4_4_ = 0.0;
                  lVar5 = vocab[lVar3].point[cw] * layer1_size;
                  for (target = 0; target < layer1_size; target = target + 1) {
                    now._4_4_ = syn0[target + lVar4] * syn1[target + lVar5] + now._4_4_;
                  }
                  if ((-6.0 < now._4_4_) && (now._4_4_ < 6.0)) {
                    fVar7 = ((float)(1 - vocab[lVar3].code[cw]) -
                            expTable[(int)((now._4_4_ + 6.0) * 83.0)]) * alpha;
                    for (target = 0; target < layer1_size; target = target + 1) {
                      *(float *)((long)__ptr_00 + target * 4) =
                           fVar7 * syn1[target + lVar5] + *(float *)((long)__ptr_00 + target * 4);
                    }
                    for (target = 0; target < layer1_size; target = target + 1) {
                      syn1[target + lVar5] = fVar7 * syn0[target + lVar4] + syn1[target + lVar5];
                    }
                  }
                }
              }
              if (0 < negative) {
                for (cw = 0; cw < negative + 1; cw = cw + 1) {
                  if (cw == 0) {
                    local_iter = 1;
                    label = lVar3;
LAB_00104b89:
                    lVar5 = label * layer1_size;
                    now._4_4_ = 0.0;
                    for (target = 0; target < layer1_size; target = target + 1) {
                      now._4_4_ = syn0[target + lVar4] * syn1neg[target + lVar5] + now._4_4_;
                    }
                    if (now._4_4_ <= 6.0) {
                      if (-6.0 <= now._4_4_) {
                        fVar7 = (float)local_iter - expTable[(int)((now._4_4_ + 6.0) * 83.0)];
                      }
                      else {
                        fVar7 = (float)local_iter;
                      }
                    }
                    else {
                      fVar7 = (float)(local_iter + -1);
                    }
                    now._0_4_ = fVar7 * alpha;
                    for (target = 0; target < layer1_size; target = target + 1) {
                      *(float *)((long)__ptr_00 + target * 4) =
                           (float)now * syn1neg[target + lVar5] +
                           *(float *)((long)__ptr_00 + target * 4);
                    }
                    for (target = 0; target < layer1_size; target = target + 1) {
                      syn1neg[target + lVar5] =
                           (float)now * syn0[target + lVar4] + syn1neg[target + lVar5];
                    }
                  }
                  else {
                    _g = (void *)((long)_g * 0x5deece66d + 0xb);
                    label = (longlong)table[((ulong)_g >> 0x10) % 100000000];
                    if (label == 0) {
                      label = (ulong)_g % (vocab_size - 1U) + 1;
                    }
                    if (label != lVar3) {
                      local_iter = 0;
                      goto LAB_00104b89;
                    }
                  }
                }
              }
              for (target = 0; target < layer1_size; target = target + 1) {
                syn0[target + lVar4] =
                     *(float *)((long)__ptr_00 + target * 4) + syn0[target + lVar4];
              }
            }
          }
        }
        else {
          word = 0;
          for (; b < (long)((long)(window * 2 + 1) - uVar6); b = b + 1) {
            if (((b != window) && (lVar4 = (word_count - window) + b, -1 < lVar4)) &&
               ((lVar4 < sentence_position && (lVar4 = sen[lVar4 + -1], lVar4 != -1)))) {
              for (target = 0; target < layer1_size; target = target + 1) {
                *(float *)((long)__ptr + target * 4) =
                     syn0[target + lVar4 * layer1_size] + *(float *)((long)__ptr + target * 4);
              }
              word = word + 1;
            }
          }
          if (word != 0) {
            for (target = 0; target < layer1_size; target = target + 1) {
              *(float *)((long)__ptr + target * 4) =
                   *(float *)((long)__ptr + target * 4) / (float)word;
            }
            if (hs != 0) {
              for (cw = 0; cw < vocab[lVar3].codelen; cw = cw + 1) {
                now._4_4_ = 0.0;
                lVar4 = vocab[lVar3].point[cw] * layer1_size;
                for (target = 0; target < layer1_size; target = target + 1) {
                  now._4_4_ = *(float *)((long)__ptr + target * 4) * syn1[target + lVar4] +
                              now._4_4_;
                }
                if ((-6.0 < now._4_4_) && (now._4_4_ < 6.0)) {
                  fVar7 = ((float)(1 - vocab[lVar3].code[cw]) -
                          expTable[(int)((now._4_4_ + 6.0) * 83.0)]) * alpha;
                  for (target = 0; target < layer1_size; target = target + 1) {
                    *(float *)((long)__ptr_00 + target * 4) =
                         fVar7 * syn1[target + lVar4] + *(float *)((long)__ptr_00 + target * 4);
                  }
                  for (target = 0; target < layer1_size; target = target + 1) {
                    syn1[target + lVar4] =
                         fVar7 * *(float *)((long)__ptr + target * 4) + syn1[target + lVar4];
                  }
                }
              }
            }
            b = uVar6;
            if (0 < negative) {
              for (cw = 0; cw < negative + 1; cw = cw + 1) {
                if (cw == 0) {
                  local_iter = 1;
                  label = lVar3;
LAB_001043d1:
                  lVar4 = label * layer1_size;
                  now._4_4_ = 0.0;
                  for (target = 0; target < layer1_size; target = target + 1) {
                    now._4_4_ = *(float *)((long)__ptr + target * 4) * syn1neg[target + lVar4] +
                                now._4_4_;
                  }
                  if (now._4_4_ <= 6.0) {
                    if (-6.0 <= now._4_4_) {
                      fVar7 = (float)local_iter - expTable[(int)((now._4_4_ + 6.0) * 83.0)];
                    }
                    else {
                      fVar7 = (float)local_iter;
                    }
                  }
                  else {
                    fVar7 = (float)(local_iter + -1);
                  }
                  now._0_4_ = fVar7 * alpha;
                  for (target = 0; target < layer1_size; target = target + 1) {
                    *(float *)((long)__ptr_00 + target * 4) =
                         (float)now * syn1neg[target + lVar4] +
                         *(float *)((long)__ptr_00 + target * 4);
                  }
                  for (target = 0; target < layer1_size; target = target + 1) {
                    syn1neg[target + lVar4] =
                         (float)now * *(float *)((long)__ptr + target * 4) + syn1neg[target + lVar4]
                    ;
                  }
                }
                else {
                  _g = (void *)((long)_g * 0x5deece66d + 0xb);
                  label = (longlong)table[((ulong)_g >> 0x10) % 100000000];
                  if (label == 0) {
                    label = (ulong)_g % (vocab_size - 1U) + 1;
                  }
                  if (label != lVar3) {
                    local_iter = 0;
                    goto LAB_001043d1;
                  }
                }
              }
            }
            for (; b < (long)((long)(window * 2 + 1) - uVar6); b = b + 1) {
              if ((((b != window) && (lVar3 = (word_count - window) + b, -1 < lVar3)) &&
                  (lVar3 < sentence_position)) && (lVar3 = sen[lVar3 + -1], lVar3 != -1)) {
                for (target = 0; target < layer1_size; target = target + 1) {
                  lVar4 = target + lVar3 * layer1_size;
                  syn0[lVar4] = *(float *)((long)__ptr_00 + target * 4) + syn0[lVar4];
                }
              }
            }
          }
        }
        word_count = word_count + 1;
        if (sentence_position <= word_count) {
          sentence_position = 0;
        }
      }
      goto LAB_00103a51;
    }
    word_count_actual = (last_word_count - sen[1000]) + word_count_actual;
    next_random = next_random - 1;
    if (next_random == 0) {
      fclose(__stream);
      free(__ptr);
      free(__ptr_00);
      pthread_exit((void *)0x0);
    }
    last_word_count = 0;
    sen[1000] = 0;
    sentence_position = 0;
    fseek(__stream,(file_size / (long)num_threads) * (long)id,0);
  } while( true );
}

Assistant:

void *TrainModelThread(void *id) {
  long long a, b, d, cw, word, last_word, sentence_length = 0, sentence_position = 0;
  long long word_count = 0, last_word_count = 0, sen[MAX_SENTENCE_LENGTH + 1];
  long long l1, l2, c, target, label, local_iter = iter;
  unsigned long long next_random = (long long)id;
  real f, g;
  clock_t now;
  real *neu1 = (real *)calloc(layer1_size, sizeof(real));
  real *neu1e = (real *)calloc(layer1_size, sizeof(real));
    printf("Opening train file %s\n", train_file);
  FILE *fi = fopen(train_file, "rb");
  if (fi == NULL) {
    fprintf(stderr, "no such file or directory: %s", train_file);
    exit(1);
  }
  if (num_threads > 1) {
    fseek(fi, file_size / (long long)num_threads * (long long)id, SEEK_SET);
  }
  while (1) {
    if (word_count - last_word_count > 10000) {
      word_count_actual += word_count - last_word_count;
      last_word_count = word_count;
      if ((debug_mode > 1)) {
        now=clock();
        printf("%cAlpha: %f  Progress: %.2f%%  Words/thread/sec: %.2fk  ", 13, alpha,
         word_count_actual / (real)(iter * train_words + 1) * 100,
         word_count_actual / ((real)(now - start + 1) / (real)CLOCKS_PER_SEC * 1000));
        fflush(stdout);
      }
      alpha = starting_alpha * (1 - word_count_actual / (real)(iter * train_words + 1));
      if (alpha < starting_alpha * 0.0001) alpha = starting_alpha * 0.0001;
    }
    if (sentence_length == 0) {
      while (1) {
        word = ReadWordIndex(fi);
        if (feof(fi)) break;
        if (word == -1) continue;
        word_count++;
        if (word == 0) break;
        // The subsampling randomly discards frequent words while keeping the ranking same
        if (sample > 0) {
          real ran = (sqrt(vocab[word].cn / (sample * train_words)) + 1) * (sample * train_words) / vocab[word].cn;
          next_random = next_random * (unsigned long long)25214903917 + 11;
          if (ran < (next_random & 0xFFFF) / (real)65536) continue;
        }
        sen[sentence_length] = word;
        sentence_length++;
        if (sentence_length >= MAX_SENTENCE_LENGTH) break;
      }
      sentence_position = 0;
    }
    if (feof(fi) || (word_count > train_words / num_threads)) {
      word_count_actual += word_count - last_word_count;
      local_iter--;
      if (local_iter == 0) break;
      word_count = 0;
      last_word_count = 0;
      sentence_length = 0;
      fseek(fi, file_size / (long long)num_threads * (long long)id, SEEK_SET);
      continue;
    }
    word = sen[sentence_position];
    if (word == -1) continue;
    for (c = 0; c < layer1_size; c++) neu1[c] = 0;
    for (c = 0; c < layer1_size; c++) neu1e[c] = 0;
    next_random = next_random * (unsigned long long)25214903917 + 11;
    b = next_random % window;
    if (cbow) {  //train the cbow architecture
      // in -> hidden
      cw = 0;
      for (a = b; a < window * 2 + 1 - b; a++) if (a != window) {
        c = sentence_position - window + a;
        if (c < 0) continue;
        if (c >= sentence_length) continue;
        last_word = sen[c];
        if (last_word == -1) continue;
        for (c = 0; c < layer1_size; c++) neu1[c] += syn0[c + last_word * layer1_size];
        cw++;
      }
      if (cw) {
        for (c = 0; c < layer1_size; c++) neu1[c] /= cw;
        if (hs) for (d = 0; d < vocab[word].codelen; d++) {
          f = 0;
          l2 = vocab[word].point[d] * layer1_size;
          // Propagate hidden -> output
          for (c = 0; c < layer1_size; c++) f += neu1[c] * syn1[c + l2];
          if (f <= -MAX_EXP) continue;
          else if (f >= MAX_EXP) continue;
          else f = expTable[(int)((f + MAX_EXP) * (EXP_TABLE_SIZE / MAX_EXP / 2))];
          // 'g' is the gradient multiplied by the learning rate
          g = (1 - vocab[word].code[d] - f) * alpha;
          // Propagate errors output -> hidden
          for (c = 0; c < layer1_size; c++) neu1e[c] += g * syn1[c + l2];
          // Learn weights hidden -> output
          for (c = 0; c < layer1_size; c++) syn1[c + l2] += g * neu1[c];
        }
        // NEGATIVE SAMPLING
        if (negative > 0) for (d = 0; d < negative + 1; d++) {
          if (d == 0) {
            target = word;
            label = 1;
          } else {
            next_random = next_random * (unsigned long long)25214903917 + 11;
            target = table[(next_random >> 16) % table_size];
            if (target == 0) target = next_random % (vocab_size - 1) + 1;
            if (target == word) continue;
            label = 0;
          }
          l2 = target * layer1_size;
          f = 0;
          for (c = 0; c < layer1_size; c++) f += neu1[c] * syn1neg[c + l2];
          if (f > MAX_EXP) g = (label - 1) * alpha;
          else if (f < -MAX_EXP) g = (label - 0) * alpha;
          else g = (label - expTable[(int)((f + MAX_EXP) * (EXP_TABLE_SIZE / MAX_EXP / 2))]) * alpha;
          for (c = 0; c < layer1_size; c++) neu1e[c] += g * syn1neg[c + l2];
          for (c = 0; c < layer1_size; c++) syn1neg[c + l2] += g * neu1[c];
        }
        // hidden -> in
        for (a = b; a < window * 2 + 1 - b; a++) if (a != window) {
          c = sentence_position - window + a;
          if (c < 0) continue;
          if (c >= sentence_length) continue;
          last_word = sen[c];
          if (last_word == -1) continue;
          for (c = 0; c < layer1_size; c++) syn0[c + last_word * layer1_size] += neu1e[c];
        }
      }
    } else {  //train skip-gram
      for (a = b; a < window * 2 + 1 - b; a++) if (a != window) {
        c = sentence_position - window + a;
        if (c < 0) continue;
        if (c >= sentence_length) continue;
        last_word = sen[c];
        if (last_word == -1) continue;
        l1 = last_word * layer1_size;
        for (c = 0; c < layer1_size; c++) neu1e[c] = 0;
        // HIERARCHICAL SOFTMAX
        if (hs) for (d = 0; d < vocab[word].codelen; d++) {
          f = 0;
          l2 = vocab[word].point[d] * layer1_size;
          // Propagate hidden -> output
          for (c = 0; c < layer1_size; c++) f += syn0[c + l1] * syn1[c + l2];
          if (f <= -MAX_EXP) continue;
          else if (f >= MAX_EXP) continue;
          else f = expTable[(int)((f + MAX_EXP) * (EXP_TABLE_SIZE / MAX_EXP / 2))];
          // 'g' is the gradient multiplied by the learning rate
          g = (1 - vocab[word].code[d] - f) * alpha;
          // Propagate errors output -> hidden
          for (c = 0; c < layer1_size; c++) neu1e[c] += g * syn1[c + l2];
          // Learn weights hidden -> output
          for (c = 0; c < layer1_size; c++) syn1[c + l2] += g * syn0[c + l1];
        }
        // NEGATIVE SAMPLING
        if (negative > 0) for (d = 0; d < negative + 1; d++) {
          if (d == 0) {
            target = word;
            label = 1;
          } else {
            next_random = next_random * (unsigned long long)25214903917 + 11;
            target = table[(next_random >> 16) % table_size];
            if (target == 0) target = next_random % (vocab_size - 1) + 1;
            if (target == word) continue;
            label = 0;
          }
          l2 = target * layer1_size;
          f = 0;
          for (c = 0; c < layer1_size; c++) f += syn0[c + l1] * syn1neg[c + l2];
          if (f > MAX_EXP) g = (label - 1) * alpha;
          else if (f < -MAX_EXP) g = (label - 0) * alpha;
          else g = (label - expTable[(int)((f + MAX_EXP) * (EXP_TABLE_SIZE / MAX_EXP / 2))]) * alpha;
          for (c = 0; c < layer1_size; c++) neu1e[c] += g * syn1neg[c + l2];
          for (c = 0; c < layer1_size; c++) syn1neg[c + l2] += g * syn0[c + l1];
        }
        // Learn weights input -> hidden
        for (c = 0; c < layer1_size; c++) syn0[c + l1] += neu1e[c];
      }
    }
    sentence_position++;
    if (sentence_position >= sentence_length) {
      sentence_length = 0;
      continue;
    }
  }
  fclose(fi);
  free(neu1);
  free(neu1e);
  pthread_exit(NULL);
}